

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestSubdirCommand::InitialPass
          (cmCTestSubdirCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmExecutionStatus *this_00;
  bool bVar1;
  int __errnum;
  char *__rhs;
  bool collapse;
  allocator<char> local_179;
  undefined1 local_178 [8];
  string m;
  char *testFilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  cmWorkingDirectory workdir;
  undefined1 local_c0 [3];
  bool readit;
  string fname;
  string *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string cwd;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTestSubdirCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
  else {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)&__range1,(SystemTools *)0x1,collapse);
    this_00 = param_2_local;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
    arg = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&arg), bVar1) {
      fname.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      std::__cxx11::string::string((string *)local_c0);
      bVar1 = cmsys::SystemTools::FileIsFullPath((string *)fname.field_2._8_8_);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_c0,(string *)fname.field_2._8_8_);
      }
      else {
        std::__cxx11::string::operator=((string *)local_c0,(string *)&__range1);
        std::__cxx11::string::operator+=((string *)local_c0,"/");
        std::__cxx11::string::operator+=((string *)local_c0,(string *)fname.field_2._8_8_);
      }
      bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_c0);
      if (bVar1) {
        workdir.ResultCode._3_1_ = 0;
        cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_f0,(string *)local_c0);
        bVar1 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_f0);
        if (bVar1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &testFilename,"Failed to change directory to ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0);
          std::operator+(&local_130,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &testFilename," : ");
          __errnum = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_f0);
          __rhs = strerror(__errnum);
          std::operator+(&local_110,&local_130,__rhs);
          cmCommand::SetError(&this->super_cmCommand,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&testFilename);
          this_local._7_1_ = 0;
          workdir._36_4_ = 1;
        }
        else {
          bVar1 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
          if (bVar1) {
            m.field_2._8_8_ = anon_var_dwarf_3899;
          }
          else {
            bVar1 = cmsys::SystemTools::FileExists("DartTestfile.txt");
            if (!bVar1) {
              workdir._36_4_ = 3;
              goto LAB_001e16d1;
            }
            m.field_2._8_8_ = anon_var_dwarf_38af;
          }
          std::__cxx11::string::operator+=((string *)local_c0,"/");
          std::__cxx11::string::operator+=((string *)local_c0,(char *)m.field_2._8_8_);
          workdir.ResultCode._3_1_ =
               cmMakefile::ReadDependentFile
                         ((this->super_cmCommand).Makefile,(string *)local_c0,true);
          workdir._36_4_ = 0;
        }
LAB_001e16d1:
        cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_f0);
        if (workdir._36_4_ == 0) {
          if ((workdir.ResultCode._3_1_ & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_178,"Could not find include file: ",&local_179);
            std::allocator<char>::~allocator(&local_179);
            std::__cxx11::string::operator+=((string *)local_178,(string *)local_c0);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_178);
            this_local._7_1_ = 0;
            workdir._36_4_ = 1;
            std::__cxx11::string::~string((string *)local_178);
          }
          else {
            workdir._36_4_ = 0;
          }
        }
      }
      else {
        workdir._36_4_ = 3;
      }
      std::__cxx11::string::~string((string *)local_c0);
      if ((workdir._36_4_ != 0) && (workdir._36_4_ != 3)) goto LAB_001e182a;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = 1;
    workdir._36_4_ = 1;
LAB_001e182a:
    std::__cxx11::string::~string((string *)&__range1);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestSubdirCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  for (std::string const& arg : args) {
    std::string fname;

    if (cmSystemTools::FileIsFullPath(arg)) {
      fname = arg;
    } else {
      fname = cwd;
      fname += "/";
      fname += arg;
    }

    if (!cmSystemTools::FileIsDirectory(fname)) {
      // No subdirectory? So what...
      continue;
    }
    bool readit = false;
    {
      cmWorkingDirectory workdir(fname);
      if (workdir.Failed()) {
        this->SetError("Failed to change directory to " + fname + " : " +
                       std::strerror(workdir.GetLastResult()));
        return false;
      }
      const char* testFilename;
      if (cmSystemTools::FileExists("CTestTestfile.cmake")) {
        // does the CTestTestfile.cmake exist ?
        testFilename = "CTestTestfile.cmake";
      } else if (cmSystemTools::FileExists("DartTestfile.txt")) {
        // does the DartTestfile.txt exist ?
        testFilename = "DartTestfile.txt";
      } else {
        // No CTestTestfile? Who cares...
        continue;
      }
      fname += "/";
      fname += testFilename;
      readit = this->Makefile->ReadDependentFile(fname);
    }
    if (!readit) {
      std::string m = "Could not find include file: ";
      m += fname;
      this->SetError(m);
      return false;
    }
  }
  return true;
}